

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PopItemFlag(void)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  int *piVar3;
  ImGuiWindow *window;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  ImGuiItemFlags IVar4;
  
  pIVar2 = GetCurrentWindow();
  ImVector<int>::pop_back
            ((ImVector<int> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  bVar1 = ImVector<int>::empty(&(pIVar2->DC).ItemFlagsStack);
  if (bVar1) {
    IVar4 = 0;
  }
  else {
    piVar3 = ImVector<int>::back((ImVector<int> *)
                                 CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    IVar4 = *piVar3;
  }
  (pIVar2->DC).ItemFlags = IVar4;
  return;
}

Assistant:

void ImGui::PopItemFlag()
{
    ImGuiWindow* window = GetCurrentWindow();
    window->DC.ItemFlagsStack.pop_back();
    window->DC.ItemFlags = window->DC.ItemFlagsStack.empty() ? ImGuiItemFlags_Default_ : window->DC.ItemFlagsStack.back();
}